

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

bool ProcessCommand(char *buffer,Player *player,bool *client_connected)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined1 local_4e0 [64];
  string local_4a0 [48];
  int local_470;
  byte local_469;
  int num;
  bool valid_cmd;
  string arg;
  string local_448 [8];
  string command;
  char local_428 [8];
  char s_arg [512];
  char s_command [512];
  bool *client_connected_local;
  Player *player_local;
  char *buffer_local;
  
  std::__cxx11::string::string(local_448);
  std::__cxx11::string::string((string *)&num);
  local_469 = 1;
  local_470 = __isoc99_sscanf(buffer,"%s %s",s_arg + 0x1f8,local_428);
  std::__cxx11::string::operator=(local_448,s_arg + 0x1f8);
  std::__cxx11::string::operator=((string *)&num,local_428);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_448,"join");
  if ((bVar2) && (local_470 == 2)) {
    std::__cxx11::string::string(local_4a0,(string *)&num);
    CreateJoinGame(player,(string *)local_4a0);
    std::__cxx11::string::~string(local_4a0);
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_448,"register");
    if ((bVar2) && (local_470 == 2)) {
      std::__cxx11::string::string((string *)(local_4e0 + 0x20),(string *)&num);
      Player::SetName(player,(string *)(local_4e0 + 0x20));
      std::__cxx11::string::~string((string *)(local_4e0 + 0x20));
      iVar3 = Player::GetSocket(player);
      SendStatus(iVar3,REGISTERED);
      poVar4 = std::operator<<((ostream *)&std::cout,"Registered player name \"");
      poVar4 = std::operator<<(poVar4,(string *)&num);
      poVar4 = std::operator<<(poVar4,"\"");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_448,"list");
      if ((bVar2) && (local_470 == 1)) {
        ListGames(player);
        Player::GetName_abi_cxx11_((Player *)local_4e0);
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_4e0);
        poVar4 = std::operator<<(poVar4," listed all open games");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)local_4e0);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_448,"leave");
        if ((bVar2) && (local_470 == 1)) {
          iVar3 = Player::GetSocket(player);
          SendStatus(iVar3,PLAYER_DISCONNECT);
          *client_connected = false;
        }
        else {
          local_469 = 0;
        }
      }
    }
  }
  bVar1 = local_469;
  std::__cxx11::string::~string((string *)&num);
  std::__cxx11::string::~string(local_448);
  return (bool)(bVar1 & 1);
}

Assistant:

bool ProcessCommand(char buffer[], Player & player, bool & client_connected)
{
    char s_command[BUF_SIZE], s_arg[BUF_SIZE];
    string command, arg;
    bool valid_cmd = true;

    // Convert the input command into separate command and argument
    int num = sscanf(buffer, "%s %s", s_command, s_arg);
    command = s_command;
    arg = s_arg;

    // Scanf needs to have captured either one or two strings
    if(command == "join" && num == 2)
    {
        CreateJoinGame(player, arg);
    }
    else if (command == "register" && num == 2)
    {
        // Set the player's name
        player.SetName(arg);
        SendStatus(player.GetSocket(), REGISTERED);
        cout << "Registered player name \"" << arg << "\"" << endl;
    }
    else if (command == "list" && num == 1)
    {
        ListGames(player);
        cout << player.GetName() << " listed all open games" << endl;
    }
    else if (command == "leave" && num == 1)
    {
        SendStatus(player.GetSocket(), PLAYER_DISCONNECT);
        client_connected = false;
    }
    else
        valid_cmd = false;

    return valid_cmd;
}